

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O0

int Llb_Nonlin4CoreReach(Aig_Man_t *pAig,Gia_ParLlb_t *pPars)

{
  int iVar1;
  abctime aVar2;
  Llb_Mnx_t *p;
  abctime aVar3;
  abctime clk;
  int RetValue;
  Llb_Mnx_t *pMnn;
  Gia_ParLlb_t *pPars_local;
  Aig_Man_t *pAig_local;
  
  clk._4_4_ = -1;
  if (pPars->fVerbose != 0) {
    Aig_ManPrintStats(pAig);
  }
  if ((pPars->fCluster != 0) && (iVar1 = Aig_ManObjNum(pAig), 0x7fff < iVar1)) {
    printf("The number of objects is more than 2^15.  Clustering cannot be used.\n");
    return -1;
  }
  aVar2 = Abc_Clock();
  p = Llb_MnxStart(pAig,pPars);
  if (pPars->fSkipReach == 0) {
    clk._4_4_ = Llb_Nonlin4Reachability(p);
  }
  aVar3 = Abc_Clock();
  p->timeTotal = aVar3 - aVar2;
  Llb_MnxStop(p);
  return clk._4_4_;
}

Assistant:

int Llb_Nonlin4CoreReach( Aig_Man_t * pAig, Gia_ParLlb_t * pPars )
{
    Llb_Mnx_t * pMnn;
    int RetValue = -1;
    if ( pPars->fVerbose )
    Aig_ManPrintStats( pAig );
    if ( pPars->fCluster && Aig_ManObjNum(pAig) >= (1 << 15) )
    {
        printf( "The number of objects is more than 2^15.  Clustering cannot be used.\n" );
        return RetValue;
    }
    {
        abctime clk = Abc_Clock();
        pMnn = Llb_MnxStart( pAig, pPars );
//Llb_MnxCheckNextStateVars( pMnn );
        if ( !pPars->fSkipReach )
            RetValue = Llb_Nonlin4Reachability( pMnn );
        pMnn->timeTotal = Abc_Clock() - clk;
        Llb_MnxStop( pMnn );
    }
    return RetValue;
}